

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O3

void __thiscall Assimp::MemoryIOSystem::Close(MemoryIOSystem *this,IOStream *pFile)

{
  IOStream **__src;
  IOSystem *pIVar1;
  __normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
  __dest;
  IOStream **ppIVar2;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Assimp::IOStream**,std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::IOStream*const>>
                     ((this->created_streams).
                      super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (this->created_streams).
                      super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  ppIVar2 = (this->created_streams).
            super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__dest._M_current == ppIVar2) {
    pIVar1 = this->existing_io;
    if (pIVar1 != (IOSystem *)0x0) {
      (*pIVar1->_vptr_IOSystem[5])(pIVar1,pFile);
    }
  }
  else {
    if (pFile != (IOStream *)0x0) {
      (*pFile->_vptr_IOStream[1])();
      ppIVar2 = (this->created_streams).
                super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    __src = __dest._M_current + 1;
    if (__src != ppIVar2) {
      memmove(__dest._M_current,__src,(long)ppIVar2 - (long)__src);
      ppIVar2 = (this->created_streams).
                super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    (this->created_streams).
    super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar2 + -1;
  }
  return;
}

Assistant:

void Close( IOStream* pFile) override {
        auto it = std::find(created_streams.begin(), created_streams.end(), pFile);
        if (it != created_streams.end()) {
            delete pFile;
            created_streams.erase(it);
        } else if (existing_io) {
            existing_io->Close(pFile);
        }
    }